

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

Maybe<capnp::Orphan<capnp::compiler::Declaration>_> * __thiscall
capnp::compiler::CapnpParser::parseStatement
          (Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *__return_storage_ptr__,
          CapnpParser *this,Reader statement,DeclParser *parser)

{
  int *__return_storage_ptr___00;
  uint *__return_storage_ptr___01;
  ErrorReporter *pEVar1;
  Reader statement_00;
  uint uVar2;
  bool bVar3;
  Which WVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *other;
  DeclParserResult *pDVar8;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  *parser_00;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *other_00;
  Orphan<capnp::compiler::Declaration> *pOVar9;
  Reader *pRVar10;
  EndOfInput_ *in_RCX;
  Iterator IVar11;
  Iterator IVar12;
  Iterator IVar13;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar14;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  end;
  StringPtr local_490;
  Reader *local_480;
  uint local_478;
  Reader *local_470;
  uint local_468;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_460;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_450;
  TemporaryPointer<capnp::compiler::Token::Reader> local_440;
  Reader *local_410;
  uint local_408;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_400;
  Reader *local_3f0;
  uint local_3e8;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_3e0;
  TemporaryPointer<capnp::compiler::Token::Reader> local_3d0;
  Reader *local_3a0;
  uint local_398;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_390;
  uint local_37c;
  Reader *pRStack_378;
  uint32_t bestByte;
  uint local_370;
  undefined1 local_368 [8];
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  best;
  StringPtr local_350;
  Array<capnp::Orphan<capnp::compiler::Declaration>_> local_340;
  Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> local_328;
  word *local_308;
  Maybe<capnp::Orphan<capnp::compiler::Declaration>_> local_2d8;
  undefined1 local_2b0 [8];
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> member;
  Reader memberStatement;
  undefined1 local_248 [8];
  Iterator __end5;
  undefined1 local_228 [8];
  Iterator __begin5;
  Reader *__range5;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> members;
  Reader memberStatements;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  *memberParser;
  size_t local_1b0;
  ArrayPtr<const_char> local_1a8;
  undefined1 local_198 [8];
  BuilderFor<capnp::compiler::Declaration> builder;
  Maybe<capnp::compiler::CapnpParser::DeclParserResult> local_160;
  undefined1 local_120 [8];
  NullableValue<capnp::compiler::CapnpParser::DeclParserResult> output;
  undefined1 local_a0 [8];
  ParserInput parserInput;
  Reader tokens;
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  fullParser;
  DeclParser *parser_local;
  CapnpParser *this_local;
  
  __return_storage_ptr___00 = &tokens.reader.nestingLimit;
  kj::parse::
  sequence<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>const&,kj::parse::EndOfInput_const&>
            ((Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
              *)__return_storage_ptr___00,(parse *)parser,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
              *)&kj::parse::endOfInput,in_RCX);
  __return_storage_ptr___01 = &parserInput.best.index;
  Statement::Reader::getTokens((Reader *)__return_storage_ptr___01,&statement);
  IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin
                     ((Reader *)__return_storage_ptr___01);
  IVar12 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end
                     ((Reader *)__return_storage_ptr___01);
  output.field_1._48_8_ = IVar12.container;
  IVar14._12_4_ = 0;
  IVar14.container = (Reader *)SUB128(IVar11._0_12_,0);
  IVar14.index = SUB124(IVar11._0_12_,8);
  end._12_4_ = 0;
  end.container = (Reader *)SUB128(IVar12._0_12_,0);
  end.index = SUB124(IVar12._0_12_,8);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                   *)local_a0,IVar14,end);
  kj::parse::
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  ::
  operator()<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>_>
            (&local_160,
             (Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
              *)__return_storage_ptr___00,
             (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
              *)local_a0);
  other = kj::_::readMaybe<capnp::compiler::CapnpParser::DeclParserResult>(&local_160);
  kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::NullableValue
            ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)local_120,other);
  kj::Maybe<capnp::compiler::CapnpParser::DeclParserResult>::~Maybe(&local_160);
  pDVar8 = kj::_::NullableValue::operator_cast_to_DeclParserResult_((NullableValue *)local_120);
  if (pDVar8 == (DeclParserResult *)0x0) {
    IVar14 = kj::parse::
             IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
             ::getBest((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                        *)local_a0);
    pRStack_378 = IVar14.container;
    local_370 = IVar14.index;
    local_368 = (undefined1  [8])pRStack_378;
    best.container._0_4_ = local_370;
    IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end
                       ((Reader *)&parserInput.best.index);
    local_3a0 = IVar11.container;
    local_398 = IVar11.index;
    local_390.container = local_3a0;
    local_390.index = local_398;
    bVar3 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
            ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                          *)local_368,&local_390);
    if (bVar3) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
      ::operator->(&local_3d0,
                   (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                    *)local_368);
      pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->(&local_3d0);
      local_37c = Token::Reader::getStartByte(pRVar10);
    }
    else {
      IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end
                         ((Reader *)&parserInput.best.index);
      local_3f0 = IVar11.container;
      local_3e8 = IVar11.index;
      local_3e0.container = local_3f0;
      local_3e0.index = local_3e8;
      IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin
                         ((Reader *)&parserInput.best.index);
      local_410 = IVar11.container;
      local_408 = IVar11.index;
      local_400.container = local_410;
      local_400.index = local_408;
      bVar3 = capnp::_::
              IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
              ::operator!=(&local_3e0,&local_400);
      if (bVar3) {
        IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end
                           ((Reader *)&parserInput.best.index);
        local_470 = IVar11.container;
        local_468 = IVar11.index;
        local_460.container = local_470;
        local_460.index = local_468;
        IVar14 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                 ::operator-(&local_460,1);
        local_480 = IVar14.container;
        local_478 = IVar14.index;
        local_450.container = local_480;
        local_450.index = local_478;
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        ::operator->(&local_440,&local_450);
        pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->(&local_440)
        ;
        local_37c = Token::Reader::getEndByte(pRVar10);
      }
      else {
        local_37c = Statement::Reader::getStartByte(&statement);
      }
    }
    uVar2 = local_37c;
    pEVar1 = this->errorReporter;
    kj::StringPtr::StringPtr(&local_490,"Parse error.");
    (**pEVar1->_vptr_ErrorReporter)
              (pEVar1,(ulong)uVar2,(ulong)uVar2,local_490.content.ptr,local_490.content.size_);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration>_>::Maybe
              (__return_storage_ptr__,(void *)0x0);
  }
  else {
    pDVar8 = kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::operator->
                       ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)local_120);
    Orphan<capnp::compiler::Declaration>::get
              ((BuilderFor<capnp::compiler::Declaration> *)local_198,&pDVar8->decl);
    bVar3 = Statement::Reader::hasDocComment(&statement);
    if (bVar3) {
      local_1a8 = (ArrayPtr<const_char>)Statement::Reader::getDocComment(&statement);
      Declaration::Builder::setDocComment((Builder *)local_198,(Reader)local_1a8);
    }
    uVar5 = Statement::Reader::getStartByte(&statement);
    Declaration::Builder::setStartByte((Builder *)local_198,uVar5);
    uVar5 = Statement::Reader::getEndByte(&statement);
    Declaration::Builder::setEndByte((Builder *)local_198,uVar5);
    WVar4 = Statement::Reader::which(&statement);
    if (WVar4 == LINE) {
      pDVar8 = kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::operator->
                         ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)local_120
                         );
      bVar3 = kj::
              Maybe<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_>
              ::operator!=(&pDVar8->memberParser,(void *)0x0);
      if (bVar3) {
        pEVar1 = this->errorReporter;
        uVar5 = Statement::Reader::getStartByte(&statement);
        uVar7 = Statement::Reader::getEndByte(&statement);
        kj::StringPtr::StringPtr
                  ((StringPtr *)&memberParser,
                   "This statement should end with a block, not a semicolon.");
        (**pEVar1->_vptr_ErrorReporter)(pEVar1,(ulong)uVar5,(ulong)uVar7,memberParser,local_1b0);
      }
    }
    else if (WVar4 == BLOCK) {
      pDVar8 = kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::operator->
                         ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)local_120
                         );
      parser_00 = kj::_::
                  readMaybe<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>>
                            (&pDVar8->memberParser);
      if (parser_00 ==
          (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
           *)0x0) {
        pEVar1 = this->errorReporter;
        uVar5 = Statement::Reader::getStartByte(&statement);
        uVar7 = Statement::Reader::getEndByte(&statement);
        kj::StringPtr::StringPtr
                  (&local_350,"This statement should end with a semicolon, not a block.");
        (**pEVar1->_vptr_ErrorReporter)
                  (pEVar1,(ulong)uVar5,(ulong)uVar7,local_350.content.ptr,local_350.content.size_);
      }
      else {
        Statement::Reader::getBlock((Reader *)&members.builder.disposer,&statement);
        uVar6 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::size
                          ((Reader *)&members.builder.disposer);
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::Vector
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)&__range5,(ulong)uVar6);
        __begin5._8_8_ = &members.builder.disposer;
        IVar13 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::begin
                           ((Reader *)__begin5._8_8_);
        __end5._8_8_ = IVar13.container;
        __begin5.container._0_4_ = IVar13.index;
        local_228 = (undefined1  [8])__end5._8_8_;
        IVar13 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::end
                           ((Reader *)__begin5._8_8_);
        local_248 = (undefined1  [8])IVar13.container;
        __end5.container._0_4_ = IVar13.index;
        while( true ) {
          bVar3 = capnp::_::
                  IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                  ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                                *)local_228,
                               (IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                                *)local_248);
          if (!bVar3) break;
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
          ::operator*((Reader *)&member.field_1.value.builder.location,
                      (IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                       *)local_228);
          local_308 = member.field_1.value.builder.location;
          statement_00._reader.capTable = (CapTableReader *)memberStatement._reader.segment;
          statement_00._reader.segment = (SegmentReader *)member.field_1.value.builder.location;
          statement_00._reader.data = memberStatement._reader.capTable;
          statement_00._reader.pointers = (WirePointer *)memberStatement._reader.data;
          statement_00._reader._32_8_ = memberStatement._reader.pointers;
          statement_00._reader._40_8_ = memberStatement._reader._32_8_;
          parseStatement(&local_2d8,this,statement_00,parser_00);
          other_00 = kj::_::readMaybe<capnp::Orphan<capnp::compiler::Declaration>>(&local_2d8);
          kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::NullableValue
                    ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_2b0,
                     other_00);
          kj::Maybe<capnp::Orphan<capnp::compiler::Declaration>_>::~Maybe(&local_2d8);
          pOVar9 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_2b0);
          if (pOVar9 != (Orphan<capnp::compiler::Declaration> *)0x0) {
            pOVar9 = kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::operator*
                               ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)
                                local_2b0);
            pOVar9 = kj::mv<capnp::Orphan<capnp::compiler::Declaration>>(pOVar9);
            kj::Vector<capnp::Orphan<capnp::compiler::Declaration>>::
            add<capnp::Orphan<capnp::compiler::Declaration>>
                      ((Vector<capnp::Orphan<capnp::compiler::Declaration>> *)&__range5,pOVar9);
          }
          kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::~NullableValue
                    ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_2b0);
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
          ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                        *)local_228);
        }
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::releaseAsArray
                  (&local_340,(Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)&__range5);
        anon_unknown_0::arrayToList<capnp::compiler::Declaration>
                  (&local_328,&this->orphanage,&local_340);
        Declaration::Builder::adoptNestedDecls((Builder *)local_198,&local_328);
        Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_>::~Orphan(&local_328);
        kj::Array<capnp::Orphan<capnp::compiler::Declaration>_>::~Array(&local_340);
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::~Vector
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)&__range5);
      }
    }
    pDVar8 = kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::operator->
                       ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)local_120);
    pOVar9 = kj::mv<capnp::Orphan<capnp::compiler::Declaration>>(&pDVar8->decl);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration>_>::Maybe(__return_storage_ptr__,pOVar9);
  }
  best._12_4_ = 1;
  kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::~NullableValue
            ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)local_120);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::~IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                    *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Orphan<Declaration>> CapnpParser::parseStatement(
    Statement::Reader statement, const DeclParser& parser) {
  auto fullParser = p::sequence(parser, p::endOfInput);

  auto tokens = statement.getTokens();
  ParserInput parserInput(tokens.begin(), tokens.end());

  KJ_IF_MAYBE(output, fullParser(parserInput)) {
    auto builder = output->decl.get();

    if (statement.hasDocComment()) {
      builder.setDocComment(statement.getDocComment());
    }

    builder.setStartByte(statement.getStartByte());
    builder.setEndByte(statement.getEndByte());

    switch (statement.which()) {
      case Statement::LINE:
        if (output->memberParser != nullptr) {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a block, not a semicolon.");
        }
        break;

      case Statement::BLOCK:
        KJ_IF_MAYBE(memberParser, output->memberParser) {
          auto memberStatements = statement.getBlock();
          kj::Vector<Orphan<Declaration>> members(memberStatements.size());
          for (auto memberStatement: memberStatements) {
            KJ_IF_MAYBE(member, parseStatement(memberStatement, *memberParser)) {
              members.add(kj::mv(*member));
            }
          }
          builder.adoptNestedDecls(arrayToList(orphanage, members.releaseAsArray()));
        } else {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a semicolon, not a block.");
        }
        break;
    }

    return kj::mv(output->decl);

  }